

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O1

void __thiscall
qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
          (SquareMatrix<std::complex<float>_> *this,SquareMatrix<std::complex<float>_> *matrix)

{
  long lVar1;
  complex<float> *pcVar2;
  ulong uVar3;
  
  lVar1 = matrix->size_;
  this->size_ = lVar1;
  if (lVar1 != 0) {
    uVar3 = lVar1 * lVar1 * 8;
    pcVar2 = (complex<float> *)operator_new__(-(ulong)((ulong)(lVar1 * lVar1) >> 0x3d != 0) | uVar3)
    ;
    memset(pcVar2,0,uVar3);
    (this->data_)._M_t.
    super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
    super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
    super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl = pcVar2;
    if (this->size_ != 0) {
      pcVar2 = (matrix->data_)._M_t.
               super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
               .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
      uVar3 = 0;
      do {
        (this->data_)._M_t.
        super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t
        .super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
        super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl[uVar3]._M_value =
             pcVar2[uVar3]._M_value;
        uVar3 = uVar3 + 1;
      } while (uVar3 < (ulong)(this->size_ * this->size_));
    }
    return;
  }
  __assert_fail("size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/include/qclab/dense/memory.hpp"
                ,0x12,
                "auto qclab::dense::alloc_unique_array(const int64_t) [T = std::complex<float>]");
}

Assistant:

inline int64_t size() const { return size_ ; }